

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLUri::setRegBasedAuthority(XMLUri *this,XMLCh *newRegAuth)

{
  bool bVar1;
  XMLCh *pXVar2;
  MalformedURLException *this_00;
  
  if (newRegAuth == (XMLCh *)0x0) {
    if (this->fRegAuth != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
    }
    this->fRegAuth = (XMLCh *)0x0;
    return;
  }
  if (*newRegAuth != L'\0') {
    bVar1 = isValidRegistryBasedAuthority(newRegAuth);
    if (bVar1) {
      if (this->fRegAuth != (XMLCh *)0x0) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])();
      }
      pXVar2 = XMLString::replicate(newRegAuth,this->fMemoryManager);
      this->fRegAuth = pXVar2;
      setHost(this,(XMLCh *)0x0);
      return;
    }
  }
  this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
  MalformedURLException::MalformedURLException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
             ,0x4ed,XMLNUM_URI_Component_Not_Conformant,(XMLCh *)errMsg_REGNAME,newRegAuth,
             (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
  __cxa_throw(this_00,&MalformedURLException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XMLUri::setRegBasedAuthority(const XMLCh* const newRegAuth)
{
    if ( !newRegAuth )
    {
        if (getRegBasedAuthority())
            fMemoryManager->deallocate(fRegAuth);//delete [] fRegAuth;

        fRegAuth = 0;
        return;
    }
    // reg_name = 1*( unreserved | escaped | "$" | "," |
    //            ";" | ":" | "@" | "&" | "=" | "+" )
    else if ( !*newRegAuth || !isValidRegistryBasedAuthority(newRegAuth) )
    {
        ThrowXMLwithMemMgr2(MalformedURLException
                , XMLExcepts::XMLNUM_URI_Component_Not_Conformant
                , errMsg_REGNAME
                , newRegAuth
                , fMemoryManager);
    }

    if (getRegBasedAuthority())
        fMemoryManager->deallocate(fRegAuth);//delete [] fRegAuth;

    fRegAuth = XMLString::replicate(newRegAuth, fMemoryManager);
    setHost(0);
}